

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O1

double __thiscall
imrt::ApertureILS::localSearch
          (ApertureILS *this,pair<bool,_std::pair<imrt::Station_*,_int>_> target_beam,Plan *P)

{
  list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_> *plVar1;
  size_t *psVar2;
  char cVar3;
  int iVar4;
  _List_node_base *p_Var5;
  bool bVar6;
  int iVar7;
  _List_node_base *p_Var8;
  ApertureILS *this_00;
  double c_eval;
  double in_XMM1_Qa;
  
  c_eval = Plan::getEvaluation(P);
  iVar4 = this->ls_type;
  cVar3 = (this->super_ILS).field_0x25;
  if (cVar3 == '\x01') {
    if ((this->super_ILS).field_0x24 == '\0') {
      this_00 = (ApertureILS *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ls aperture ",0xe)
      ;
    }
    else {
LAB_001255ca:
      if ((this->super_ILS).field_0x24 != '\x01') goto LAB_001255eb;
      if (target_beam.first == false) {
        bVar6 = Station::anyClosed(target_beam.second.first,target_beam.second.second);
      }
      else {
        bVar6 = Station::anyOpen(target_beam.second.first,target_beam.second.second);
      }
      iVar7 = rand();
      if ((bVar6 == false) || ((double)iVar7 / 2147483647.0 <= this->prob_intensity)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", ls intensity",0xe);
        goto LAB_0012559e;
      }
      this_00 = (ApertureILS *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ls aperture",0xd);
    }
    in_XMM1_Qa = improvementAperture(this_00,target_beam.second.second,target_beam.second.first,
                                     (bool)(target_beam.first ^ 1),c_eval,P,iVar4 != 0);
  }
  else {
    if ((this->super_ILS).field_0x24 != '\x01') {
      if (cVar3 != '\0') goto LAB_001255ca;
LAB_001255eb:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR: Search option not recognized!!!",0x26);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      goto LAB_00125712;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ls intensity ",0xf);
LAB_0012559e:
    in_XMM1_Qa = improvementIntensity
                           (this,target_beam.second.second,target_beam.second.first,
                            (bool)(target_beam.first ^ 1),c_eval,P,iVar4 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", found: ",9);
  std::ostream::_M_insert<double>(in_XMM1_Qa);
LAB_00125712:
  plVar1 = &this->tabu;
  if (c_eval <= in_XMM1_Qa) {
    p_Var8 = (_List_node_base *)operator_new(0x20);
    p_Var8[1]._M_next = (_List_node_base *)target_beam.second.first;
    *(int *)&p_Var8[1]._M_prev = target_beam.second.second;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar2 = &(this->tabu).
              super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
              ._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
  }
  else {
    p_Var8 = (plVar1->
             super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var8 != (_List_node_base *)plVar1) {
      p_Var5 = p_Var8->_M_next;
      operator_delete(p_Var8);
      p_Var8 = p_Var5;
    }
    (this->tabu).
    super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
    (this->tabu).
    super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
    (this->tabu).
    super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
    ._M_impl._M_node._M_size = 0;
  }
  return in_XMM1_Qa;
}

Assistant:

double ApertureILS::localSearch(pair<bool, pair<Station*, int>> target_beam, Plan& P) {
  double aux_eval, local_eval=P.getEvaluation();
  bool search_a;
  bool best_improvement=ls_type;
  
  int beamlet = target_beam.second.second;
  Station* s = target_beam.second.first;
  bool sign = target_beam.first;

  if (search_aperture && !search_intensity) {
    cout << ", ls aperture ";
    aux_eval = improvementAperture(beamlet, *s, !sign, local_eval, P, best_improvement);
    cout << ", found: " << aux_eval;
  } else if (!search_aperture && search_intensity) {
    cout << ", ls intensity ";
    aux_eval = improvementIntensity(beamlet, *s, !sign, local_eval, P, best_improvement);
    cout << ", found: " << aux_eval;
  } else if (search_aperture && search_intensity) {
    if (!sign)
      search_a = s->anyClosed(beamlet);
    else 
      search_a = s->anyOpen(beamlet);

    if (((double) rand() / (RAND_MAX)) <= prob_intensity || !search_a) {
      cout << ", ls intensity";
      aux_eval = improvementIntensity(beamlet, *s,  !sign, local_eval, P, best_improvement);
      cout << ", found: " << aux_eval;
    } else {
      cout << ", ls aperture";
      aux_eval = improvementAperture(beamlet, *s, !sign, local_eval, P, best_improvement);
      cout << ", found: " << aux_eval;
    }
  } else {
    cout << "ERROR: Search option not recognized!!!" << endl;
    
  }
  if (local_eval>aux_eval) { 
    tabu.clear();
  }else{
    tabu.push_back(make_pair(s, beamlet));
  }
  return(aux_eval);
}